

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UBool compareEntries(UHashTok p1,UHashTok p2)

{
  UHashTok key1;
  UHashTok key2;
  UBool UVar1;
  undefined1 local_69;
  UHashTok path2;
  UHashTok path1;
  UHashTok name2;
  UHashTok name1;
  UResourceDataEntry *b2;
  UResourceDataEntry *b1;
  UHashTok p2_local;
  UHashTok p1_local;
  
  key1 = *(UHashTok *)((long)p1.pointer + 8);
  key2 = *(UHashTok *)((long)p2.pointer + 8);
  UVar1 = uhash_compareChars_63(*p1.pointer,*p2.pointer);
  local_69 = false;
  if (UVar1 != '\0') {
    UVar1 = uhash_compareChars_63(key1,key2);
    local_69 = UVar1 != '\0';
  }
  return local_69;
}

Assistant:

static UBool U_CALLCONV compareEntries(const UHashTok p1, const UHashTok p2) {
    UResourceDataEntry *b1 = (UResourceDataEntry *)p1.pointer;
    UResourceDataEntry *b2 = (UResourceDataEntry *)p2.pointer;
    UHashTok name1, name2, path1, path2;
    name1.pointer = b1->fName;
    name2.pointer = b2->fName;
    path1.pointer = b1->fPath;
    path2.pointer = b2->fPath;
    return (UBool)(uhash_compareChars(name1, name2) &&
        uhash_compareChars(path1, path2));
}